

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  StackItemT<embree::NodeRefPtr<4>_> SVar12;
  StackItemT<embree::NodeRefPtr<4>_> SVar13;
  StackItemT<embree::NodeRefPtr<4>_> SVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar19;
  int iVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  RTCRayN *pRVar24;
  long lVar25;
  RayHitK<4> *pRVar26;
  float *vertices;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined4 uVar32;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar72;
  float fVar85;
  float fVar86;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar89;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar101;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar113;
  float fVar115;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar117;
  undefined1 auVar109 [16];
  float fVar114;
  float fVar116;
  float fVar118;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar119;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [16];
  float fVar127;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar149;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar147;
  float fVar148;
  undefined1 auVar146 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [64];
  float fVar154;
  float fVar159;
  undefined1 auVar155 [16];
  float fVar157;
  float fVar158;
  undefined1 auVar156 [64];
  undefined1 auVar160 [16];
  undefined1 auVar161 [64];
  float fVar162;
  float fVar167;
  undefined1 auVar163 [16];
  float fVar165;
  float fVar166;
  float fVar168;
  undefined1 auVar164 [64];
  float fVar169;
  float fVar170;
  undefined1 auVar171 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  float fVar179;
  undefined1 auVar180 [16];
  float fVar185;
  undefined1 auVar181 [16];
  float fVar183;
  float fVar184;
  undefined1 auVar182 [64];
  float fVar186;
  undefined1 auVar187 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar188 [64];
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<4>_> *local_1330;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  vbool<4> valid;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 *local_1280;
  ulong local_1278;
  ulong local_1270;
  ulong local_1268;
  ulong local_1260;
  RayHitK<4> *local_1258;
  long local_1250;
  Scene *scene;
  long local_1240;
  RTCFilterFunctionNArguments args;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  vfloat<4> tNear;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RayHitK<4> *pRVar33;
  
  local_1330 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_10b8._4_4_ = uVar32;
  local_10b8._0_4_ = uVar32;
  local_10b8._8_4_ = uVar32;
  local_10b8._12_4_ = uVar32;
  auVar136 = ZEXT1664(local_10b8);
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10c8._4_4_ = uVar32;
  local_10c8._0_4_ = uVar32;
  local_10c8._8_4_ = uVar32;
  local_10c8._12_4_ = uVar32;
  auVar146 = ZEXT1664(local_10c8);
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10d8._4_4_ = uVar32;
  local_10d8._0_4_ = uVar32;
  local_10d8._8_4_ = uVar32;
  local_10d8._12_4_ = uVar32;
  auVar153 = ZEXT1664(local_10d8);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar97 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar99 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar43 = ZEXT416((uint)(fVar88 * 0.99999964));
  local_10e8 = vshufps_avx(auVar43,auVar43,0);
  auVar156 = ZEXT1664(local_10e8);
  auVar43 = ZEXT416((uint)(fVar97 * 0.99999964));
  local_10f8 = vshufps_avx(auVar43,auVar43,0);
  auVar161 = ZEXT1664(local_10f8);
  auVar43 = ZEXT416((uint)(fVar99 * 0.99999964));
  local_1108 = vshufps_avx(auVar43,auVar43,0);
  auVar164 = ZEXT1664(local_1108);
  auVar43 = ZEXT416((uint)(fVar88 * 1.0000004));
  local_1118 = vshufps_avx(auVar43,auVar43,0);
  auVar172 = ZEXT1664(local_1118);
  auVar43 = ZEXT416((uint)(fVar97 * 1.0000004));
  local_1128 = vshufps_avx(auVar43,auVar43,0);
  auVar182 = ZEXT1664(local_1128);
  auVar43 = ZEXT416((uint)(fVar99 * 1.0000004));
  local_1138 = vshufps_avx(auVar43,auVar43,0);
  auVar188 = ZEXT1664(local_1138);
  local_1260 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1268 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1270 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1278 = local_1260 ^ 0x10;
  uVar27 = local_1268 ^ 0x10;
  uVar30 = local_1270 ^ 0x10;
  iVar20 = (tray->tnear).field_0.i[k];
  auVar43._4_4_ = iVar20;
  auVar43._0_4_ = iVar20;
  auVar43._8_4_ = iVar20;
  auVar43._12_4_ = iVar20;
  iVar20 = (tray->tfar).field_0.i[k];
  auVar49 = ZEXT1664(CONCAT412(iVar20,CONCAT48(iVar20,CONCAT44(iVar20,iVar20))));
  local_1280 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar36 = local_1278;
  pRVar33 = ray;
  uVar23 = local_1260;
  uVar28 = local_1268;
  uVar29 = local_1270;
  local_1258 = ray;
  do {
    do {
      do {
        if (local_1330 == stack) {
          return;
        }
        pSVar19 = local_1330 + -1;
        local_1330 = local_1330 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar19->dist);
      sVar35 = (local_1330->ptr).ptr;
      do {
        if ((sVar35 & 8) == 0) {
          uVar21 = sVar35 & 0xfffffffffffffff0;
          fVar88 = *(float *)(ray + k * 4 + 0x70);
          auVar50._4_4_ = fVar88;
          auVar50._0_4_ = fVar88;
          auVar50._8_4_ = fVar88;
          auVar50._12_4_ = fVar88;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar23);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar23);
          auVar51._0_4_ = fVar88 * *pfVar3 + *pfVar1;
          auVar51._4_4_ = fVar88 * pfVar3[1] + pfVar1[1];
          auVar51._8_4_ = fVar88 * pfVar3[2] + pfVar1[2];
          auVar51._12_4_ = fVar88 * pfVar3[3] + pfVar1[3];
          auVar51 = vsubps_avx(auVar51,auVar136._0_16_);
          auVar62._0_4_ = auVar156._0_4_ * auVar51._0_4_;
          auVar62._4_4_ = auVar156._4_4_ * auVar51._4_4_;
          auVar62._8_4_ = auVar156._8_4_ * auVar51._8_4_;
          auVar62._12_4_ = auVar156._12_4_ * auVar51._12_4_;
          auVar51 = vmaxps_avx(auVar43,auVar62);
          pfVar3 = (float *)(uVar21 + 0x80 + uVar28);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar28);
          auVar73._0_4_ = fVar88 * *pfVar3 + *pfVar1;
          auVar73._4_4_ = fVar88 * pfVar3[1] + pfVar1[1];
          auVar73._8_4_ = fVar88 * pfVar3[2] + pfVar1[2];
          auVar73._12_4_ = fVar88 * pfVar3[3] + pfVar1[3];
          auVar62 = vsubps_avx(auVar73,auVar146._0_16_);
          auVar74._0_4_ = auVar161._0_4_ * auVar62._0_4_;
          auVar74._4_4_ = auVar161._4_4_ * auVar62._4_4_;
          auVar74._8_4_ = auVar161._8_4_ * auVar62._8_4_;
          auVar74._12_4_ = auVar161._12_4_ * auVar62._12_4_;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar29);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar29);
          auVar90._0_4_ = fVar88 * *pfVar3 + *pfVar1;
          auVar90._4_4_ = fVar88 * pfVar3[1] + pfVar1[1];
          auVar90._8_4_ = fVar88 * pfVar3[2] + pfVar1[2];
          auVar90._12_4_ = fVar88 * pfVar3[3] + pfVar1[3];
          auVar62 = vsubps_avx(auVar90,auVar153._0_16_);
          auVar91._0_4_ = auVar164._0_4_ * auVar62._0_4_;
          auVar91._4_4_ = auVar164._4_4_ * auVar62._4_4_;
          auVar91._8_4_ = auVar164._8_4_ * auVar62._8_4_;
          auVar91._12_4_ = auVar164._12_4_ * auVar62._12_4_;
          auVar62 = vmaxps_avx(auVar74,auVar91);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar51,auVar62)
          ;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar36);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar36);
          auVar75._0_4_ = fVar88 * *pfVar3 + *pfVar1;
          auVar75._4_4_ = fVar88 * pfVar3[1] + pfVar1[1];
          auVar75._8_4_ = fVar88 * pfVar3[2] + pfVar1[2];
          auVar75._12_4_ = fVar88 * pfVar3[3] + pfVar1[3];
          auVar51 = vsubps_avx(auVar75,auVar136._0_16_);
          auVar76._0_4_ = auVar172._0_4_ * auVar51._0_4_;
          auVar76._4_4_ = auVar172._4_4_ * auVar51._4_4_;
          auVar76._8_4_ = auVar172._8_4_ * auVar51._8_4_;
          auVar76._12_4_ = auVar172._12_4_ * auVar51._12_4_;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar27);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar27);
          auVar92._0_4_ = fVar88 * *pfVar3 + *pfVar1;
          auVar92._4_4_ = fVar88 * pfVar3[1] + pfVar1[1];
          auVar92._8_4_ = fVar88 * pfVar3[2] + pfVar1[2];
          auVar92._12_4_ = fVar88 * pfVar3[3] + pfVar1[3];
          auVar51 = vsubps_avx(auVar92,auVar146._0_16_);
          auVar93._0_4_ = auVar182._0_4_ * auVar51._0_4_;
          auVar93._4_4_ = auVar182._4_4_ * auVar51._4_4_;
          auVar93._8_4_ = auVar182._8_4_ * auVar51._8_4_;
          auVar93._12_4_ = auVar182._12_4_ * auVar51._12_4_;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar30);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar30);
          auVar105._0_4_ = fVar88 * *pfVar3 + *pfVar1;
          auVar105._4_4_ = fVar88 * pfVar3[1] + pfVar1[1];
          auVar105._8_4_ = fVar88 * pfVar3[2] + pfVar1[2];
          auVar105._12_4_ = fVar88 * pfVar3[3] + pfVar1[3];
          auVar51 = vsubps_avx(auVar105,auVar153._0_16_);
          auVar106._0_4_ = auVar188._0_4_ * auVar51._0_4_;
          auVar106._4_4_ = auVar188._4_4_ * auVar51._4_4_;
          auVar106._8_4_ = auVar188._8_4_ * auVar51._8_4_;
          auVar106._12_4_ = auVar188._12_4_ * auVar51._12_4_;
          auVar51 = vminps_avx(auVar93,auVar106);
          auVar62 = vminps_avx(auVar49._0_16_,auVar76);
          auVar51 = vminps_avx(auVar62,auVar51);
          if (((uint)sVar35 & 7) == 6) {
            auVar62 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar51,2);
            auVar51 = vcmpps_avx(*(undefined1 (*) [16])(uVar21 + 0xe0),auVar50,2);
            auVar50 = vcmpps_avx(auVar50,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
            auVar51 = vandps_avx(auVar51,auVar50);
            auVar51 = vandps_avx(auVar51,auVar62);
          }
          else {
            auVar51 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar51,2);
          }
          auVar51 = vpslld_avx(auVar51,0x1f);
          uVar32 = vmovmskps_avx(auVar51);
          pRVar33 = (RayHitK<4> *)CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar32);
        }
        if ((sVar35 & 8) == 0) {
          if (pRVar33 == (RayHitK<4> *)0x0) {
            iVar20 = 4;
          }
          else {
            uVar21 = sVar35 & 0xfffffffffffffff0;
            lVar40 = 0;
            if (pRVar33 != (RayHitK<4> *)0x0) {
              for (; ((ulong)pRVar33 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            iVar20 = 0;
            sVar35 = *(ulong *)(uVar21 + lVar40 * 8);
            uVar31 = (ulong)(pRVar33 + -1) & (ulong)pRVar33;
            if (uVar31 != 0) {
              uVar6 = tNear.field_0.i[lVar40];
              lVar40 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              uVar34 = *(ulong *)(uVar21 + lVar40 * 8);
              uVar5 = tNear.field_0.i[lVar40];
              uVar31 = uVar31 - 1 & uVar31;
              if (uVar31 == 0) {
                if (uVar6 < uVar5) {
                  (local_1330->ptr).ptr = uVar34;
                  local_1330->dist = uVar5;
                  local_1330 = local_1330 + 1;
                }
                else {
                  (local_1330->ptr).ptr = sVar35;
                  local_1330->dist = uVar6;
                  sVar35 = uVar34;
                  local_1330 = local_1330 + 1;
                }
              }
              else {
                auVar52._8_8_ = 0;
                auVar52._0_8_ = sVar35;
                auVar51 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar6));
                auVar63._8_8_ = 0;
                auVar63._0_8_ = uVar34;
                auVar62 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar5));
                lVar40 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
                auVar77._8_8_ = 0;
                auVar77._0_8_ = *(ulong *)(uVar21 + lVar40 * 8);
                auVar73 = vpunpcklqdq_avx(auVar77,ZEXT416((uint)tNear.field_0.i[lVar40]));
                auVar50 = vpcmpgtd_avx(auVar62,auVar51);
                uVar31 = uVar31 - 1 & uVar31;
                if (uVar31 == 0) {
                  auVar74 = vpshufd_avx(auVar50,0xaa);
                  auVar50 = vblendvps_avx(auVar62,auVar51,auVar74);
                  auVar51 = vblendvps_avx(auVar51,auVar62,auVar74);
                  auVar62 = vpcmpgtd_avx(auVar73,auVar50);
                  auVar74 = vpshufd_avx(auVar62,0xaa);
                  auVar62 = vblendvps_avx(auVar73,auVar50,auVar74);
                  auVar50 = vblendvps_avx(auVar50,auVar73,auVar74);
                  auVar73 = vpcmpgtd_avx(auVar50,auVar51);
                  auVar73 = vpshufd_avx(auVar73,0xaa);
                  SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar50,auVar51,auVar73);
                  SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar51,auVar50,auVar73);
                  *local_1330 = SVar13;
                  local_1330[1] = SVar12;
                  sVar35 = auVar62._0_8_;
                  local_1330 = local_1330 + 2;
                }
                else {
                  lVar40 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                    }
                  }
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = *(ulong *)(uVar21 + lVar40 * 8);
                  auVar75 = vpunpcklqdq_avx(auVar107,ZEXT416((uint)tNear.field_0.i[lVar40]));
                  auVar74 = vpshufd_avx(auVar50,0xaa);
                  auVar50 = vblendvps_avx(auVar62,auVar51,auVar74);
                  auVar51 = vblendvps_avx(auVar51,auVar62,auVar74);
                  auVar62 = vpcmpgtd_avx(auVar75,auVar73);
                  auVar74 = vpshufd_avx(auVar62,0xaa);
                  auVar62 = vblendvps_avx(auVar75,auVar73,auVar74);
                  auVar73 = vblendvps_avx(auVar73,auVar75,auVar74);
                  auVar74 = vpcmpgtd_avx(auVar73,auVar51);
                  auVar75 = vpshufd_avx(auVar74,0xaa);
                  auVar74 = vblendvps_avx(auVar73,auVar51,auVar75);
                  SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar51,auVar73,auVar75);
                  auVar51 = vpcmpgtd_avx(auVar62,auVar50);
                  auVar73 = vpshufd_avx(auVar51,0xaa);
                  auVar51 = vblendvps_avx(auVar62,auVar50,auVar73);
                  auVar62 = vblendvps_avx(auVar50,auVar62,auVar73);
                  auVar50 = vpcmpgtd_avx(auVar74,auVar62);
                  auVar50 = vpshufd_avx(auVar50,0xaa);
                  SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar74,auVar62,auVar50);
                  SVar14 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar62,auVar74,auVar50);
                  *local_1330 = SVar12;
                  local_1330[1] = SVar14;
                  local_1330[2] = SVar13;
                  sVar35 = auVar51._0_8_;
                  local_1330 = local_1330 + 3;
                }
              }
            }
          }
        }
        else {
          iVar20 = 6;
        }
      } while (iVar20 == 0);
    } while (iVar20 != 6);
    local_1250 = (ulong)((uint)sVar35 & 0xf) - 8;
    if (local_1250 != 0) {
      uVar36 = sVar35 & 0xfffffffffffffff0;
      local_1240 = 0;
      pRVar26 = ray;
      do {
        ray = local_1258;
        lVar22 = local_1240 * 0x50;
        pSVar7 = context->scene;
        pGVar8 = (pSVar7->geometries).items[*(uint *)(uVar36 + 0x30 + lVar22)].ptr;
        fVar88 = (pGVar8->time_range).lower;
        fVar88 = pGVar8->fnumTimeSegments *
                 ((*(float *)(pRVar26 + k * 4 + 0x70) - fVar88) /
                 ((pGVar8->time_range).upper - fVar88));
        auVar51 = vroundss_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88),9);
        auVar51 = vminss_avx(auVar51,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
        auVar106 = vmaxss_avx(ZEXT816(0),auVar51);
        lVar25 = (long)(int)auVar106._0_4_ * 0x38;
        uVar39 = (ulong)*(uint *)(uVar36 + 4 + lVar22);
        lVar40 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar25);
        lVar25 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar25);
        auVar51 = *(undefined1 (*) [16])(lVar40 + (ulong)*(uint *)(uVar36 + lVar22) * 4);
        uVar41 = (ulong)*(uint *)(uVar36 + 0x10 + lVar22);
        auVar62 = *(undefined1 (*) [16])(lVar40 + uVar41 * 4);
        uVar28 = (ulong)*(uint *)(uVar36 + 0x20 + lVar22);
        auVar107 = *(undefined1 (*) [16])(lVar40 + uVar28 * 4);
        auVar50 = *(undefined1 (*) [16])(lVar40 + uVar39 * 4);
        uVar21 = (ulong)*(uint *)(uVar36 + 0x14 + lVar22);
        auVar73 = *(undefined1 (*) [16])(lVar40 + uVar21 * 4);
        uVar29 = (ulong)*(uint *)(uVar36 + 0x24 + lVar22);
        auVar64 = *(undefined1 (*) [16])(lVar40 + uVar29 * 4);
        uVar23 = (ulong)*(uint *)(uVar36 + 8 + lVar22);
        auVar74 = *(undefined1 (*) [16])(lVar40 + uVar23 * 4);
        uVar37 = (ulong)*(uint *)(uVar36 + 0x18 + lVar22);
        auVar75 = *(undefined1 (*) [16])(lVar40 + uVar37 * 4);
        uVar31 = (ulong)*(uint *)(uVar36 + 0x28 + lVar22);
        auVar76 = *(undefined1 (*) [16])(lVar40 + uVar31 * 4);
        uVar42 = (ulong)*(uint *)(uVar36 + 0xc + lVar22);
        auVar90 = *(undefined1 (*) [16])(lVar40 + uVar42 * 4);
        uVar38 = (ulong)*(uint *)(uVar36 + 0x1c + lVar22);
        auVar91 = *(undefined1 (*) [16])(lVar40 + uVar38 * 4);
        uVar34 = (ulong)*(uint *)(uVar36 + 0x2c + lVar22);
        auVar92 = *(undefined1 (*) [16])(lVar40 + uVar34 * 4);
        auVar93 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar36 + lVar22) * 4);
        auVar105 = *(undefined1 (*) [16])(lVar25 + uVar41 * 4);
        fVar88 = fVar88 - auVar106._0_4_;
        auVar106 = vunpcklps_avx(auVar51,auVar74);
        auVar74 = vunpckhps_avx(auVar51,auVar74);
        auVar52 = vunpcklps_avx(auVar50,auVar90);
        auVar50 = vunpckhps_avx(auVar50,auVar90);
        auVar51 = *(undefined1 (*) [16])(lVar25 + uVar39 * 4);
        auVar63 = vunpcklps_avx(auVar74,auVar50);
        auVar77 = vunpcklps_avx(auVar106,auVar52);
        auVar74 = vunpckhps_avx(auVar106,auVar52);
        auVar90 = vunpcklps_avx(auVar62,auVar75);
        auVar50 = vunpckhps_avx(auVar62,auVar75);
        auVar75 = vunpcklps_avx(auVar73,auVar91);
        auVar73 = vunpckhps_avx(auVar73,auVar91);
        auVar62 = *(undefined1 (*) [16])(lVar25 + uVar23 * 4);
        auVar91 = vunpcklps_avx(auVar50,auVar73);
        auVar106 = vunpcklps_avx(auVar90,auVar75);
        auVar73 = vunpckhps_avx(auVar90,auVar75);
        auVar90 = vunpcklps_avx(auVar107,auVar76);
        auVar75 = vunpckhps_avx(auVar107,auVar76);
        auVar52 = vunpcklps_avx(auVar64,auVar92);
        auVar76 = vunpckhps_avx(auVar64,auVar92);
        auVar50 = *(undefined1 (*) [16])(lVar25 + uVar42 * 4);
        auVar92 = vunpcklps_avx(auVar75,auVar76);
        auVar107 = vunpcklps_avx(auVar90,auVar52);
        auVar75 = vunpckhps_avx(auVar90,auVar52);
        auVar76 = vunpcklps_avx(auVar93,auVar62);
        auVar62 = vunpckhps_avx(auVar93,auVar62);
        auVar90 = vunpcklps_avx(auVar51,auVar50);
        auVar50 = vunpckhps_avx(auVar51,auVar50);
        auVar51 = *(undefined1 (*) [16])(lVar25 + uVar37 * 4);
        auVar93 = vunpcklps_avx(auVar62,auVar50);
        auVar52 = vunpcklps_avx(auVar76,auVar90);
        auVar50 = vunpckhps_avx(auVar76,auVar90);
        auVar90 = vunpcklps_avx(auVar105,auVar51);
        auVar76 = vunpckhps_avx(auVar105,auVar51);
        auVar51 = *(undefined1 (*) [16])(lVar25 + uVar21 * 4);
        auVar62 = *(undefined1 (*) [16])(lVar25 + uVar38 * 4);
        auVar105 = vunpcklps_avx(auVar51,auVar62);
        auVar51 = vunpckhps_avx(auVar51,auVar62);
        auVar64 = vunpcklps_avx(auVar76,auVar51);
        auVar53 = vunpcklps_avx(auVar90,auVar105);
        auVar76 = vunpckhps_avx(auVar90,auVar105);
        auVar51 = *(undefined1 (*) [16])(lVar25 + uVar28 * 4);
        auVar62 = *(undefined1 (*) [16])(lVar25 + uVar31 * 4);
        auVar105 = vunpcklps_avx(auVar51,auVar62);
        auVar90 = vunpckhps_avx(auVar51,auVar62);
        auVar51 = *(undefined1 (*) [16])(lVar25 + uVar29 * 4);
        auVar62 = *(undefined1 (*) [16])(lVar25 + uVar34 * 4);
        auVar65 = vunpcklps_avx(auVar51,auVar62);
        auVar51 = vunpckhps_avx(auVar51,auVar62);
        auVar66 = vunpcklps_avx(auVar90,auVar51);
        auVar78 = vunpcklps_avx(auVar105,auVar65);
        auVar90 = vunpckhps_avx(auVar105,auVar65);
        auVar51 = vshufps_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88),0);
        auVar62 = vshufps_avx(ZEXT416((uint)(1.0 - fVar88)),ZEXT416((uint)(1.0 - fVar88)),0);
        fVar72 = auVar51._0_4_;
        fVar85 = auVar51._4_4_;
        fVar86 = auVar51._8_4_;
        fVar87 = auVar51._12_4_;
        fVar88 = auVar62._0_4_;
        fVar97 = auVar62._4_4_;
        fVar99 = auVar62._8_4_;
        fVar167 = auVar62._12_4_;
        auVar120._0_4_ = fVar88 * auVar77._0_4_ + fVar72 * auVar52._0_4_;
        auVar120._4_4_ = fVar97 * auVar77._4_4_ + fVar85 * auVar52._4_4_;
        auVar120._8_4_ = fVar99 * auVar77._8_4_ + fVar86 * auVar52._8_4_;
        auVar120._12_4_ = fVar167 * auVar77._12_4_ + fVar87 * auVar52._12_4_;
        auVar128._0_4_ = fVar88 * auVar74._0_4_ + fVar72 * auVar50._0_4_;
        auVar128._4_4_ = fVar97 * auVar74._4_4_ + fVar85 * auVar50._4_4_;
        auVar128._8_4_ = fVar99 * auVar74._8_4_ + fVar86 * auVar50._8_4_;
        auVar128._12_4_ = fVar167 * auVar74._12_4_ + fVar87 * auVar50._12_4_;
        local_12a8 = auVar63._0_4_;
        fStack_12a4 = auVar63._4_4_;
        fStack_12a0 = auVar63._8_4_;
        fStack_129c = auVar63._12_4_;
        auVar94._0_4_ = fVar88 * local_12a8 + fVar72 * auVar93._0_4_;
        auVar94._4_4_ = fVar97 * fStack_12a4 + fVar85 * auVar93._4_4_;
        auVar94._8_4_ = fVar99 * fStack_12a0 + fVar86 * auVar93._8_4_;
        auVar94._12_4_ = fVar167 * fStack_129c + fVar87 * auVar93._12_4_;
        auVar138._0_4_ = fVar88 * auVar106._0_4_ + fVar72 * auVar53._0_4_;
        auVar138._4_4_ = fVar97 * auVar106._4_4_ + fVar85 * auVar53._4_4_;
        auVar138._8_4_ = fVar99 * auVar106._8_4_ + fVar86 * auVar53._8_4_;
        auVar138._12_4_ = fVar167 * auVar106._12_4_ + fVar87 * auVar53._12_4_;
        auVar108._0_4_ = fVar88 * auVar73._0_4_ + fVar72 * auVar76._0_4_;
        auVar108._4_4_ = fVar97 * auVar73._4_4_ + fVar85 * auVar76._4_4_;
        auVar108._8_4_ = fVar99 * auVar73._8_4_ + fVar86 * auVar76._8_4_;
        auVar108._12_4_ = fVar167 * auVar73._12_4_ + fVar87 * auVar76._12_4_;
        puVar2 = (undefined8 *)(uVar36 + 0x30 + lVar22);
        local_1018 = *puVar2;
        uStack_1010 = puVar2[1];
        puVar2 = (undefined8 *)(uVar36 + 0x40 + lVar22);
        local_12d8._0_4_ = auVar91._0_4_;
        local_12d8._4_4_ = auVar91._4_4_;
        fStack_12d0 = auVar91._8_4_;
        fStack_12cc = auVar91._12_4_;
        auVar53._0_4_ = fVar88 * (float)local_12d8._0_4_ + fVar72 * auVar64._0_4_;
        auVar53._4_4_ = fVar97 * (float)local_12d8._4_4_ + fVar85 * auVar64._4_4_;
        auVar53._8_4_ = fVar99 * fStack_12d0 + fVar86 * auVar64._8_4_;
        auVar53._12_4_ = fVar167 * fStack_12cc + fVar87 * auVar64._12_4_;
        local_12c8 = auVar107._0_4_;
        fStack_12c4 = auVar107._4_4_;
        fStack_12c0 = auVar107._8_4_;
        fStack_12bc = auVar107._12_4_;
        auVar64._0_4_ = fVar88 * local_12c8 + fVar72 * auVar78._0_4_;
        auVar64._4_4_ = fVar97 * fStack_12c4 + fVar85 * auVar78._4_4_;
        auVar64._8_4_ = fVar99 * fStack_12c0 + fVar86 * auVar78._8_4_;
        auVar64._12_4_ = fVar167 * fStack_12bc + fVar87 * auVar78._12_4_;
        local_1308 = auVar75._0_4_;
        fStack_1304 = auVar75._4_4_;
        fStack_1300 = auVar75._8_4_;
        fStack_12fc = auVar75._12_4_;
        auVar187._0_4_ = fVar88 * local_1308 + fVar72 * auVar90._0_4_;
        auVar187._4_4_ = fVar97 * fStack_1304 + fVar85 * auVar90._4_4_;
        auVar187._8_4_ = fVar99 * fStack_1300 + fVar86 * auVar90._8_4_;
        auVar187._12_4_ = fVar167 * fStack_12fc + fVar87 * auVar90._12_4_;
        local_12f8 = auVar92._0_4_;
        fStack_12f4 = auVar92._4_4_;
        fStack_12f0 = auVar92._8_4_;
        fStack_12ec = auVar92._12_4_;
        auVar150._0_4_ = fVar72 * auVar66._0_4_ + fVar88 * local_12f8;
        auVar150._4_4_ = fVar85 * auVar66._4_4_ + fVar97 * fStack_12f4;
        auVar150._8_4_ = fVar86 * auVar66._8_4_ + fVar99 * fStack_12f0;
        auVar150._12_4_ = fVar87 * auVar66._12_4_ + fVar167 * fStack_12ec;
        local_11f8 = *puVar2;
        uStack_11f0 = puVar2[1];
        uVar32 = *(undefined4 *)(local_1258 + k * 4);
        auVar163._4_4_ = uVar32;
        auVar163._0_4_ = uVar32;
        auVar163._8_4_ = uVar32;
        auVar163._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(local_1258 + k * 4 + 0x10);
        auVar171._4_4_ = uVar32;
        auVar171._0_4_ = uVar32;
        auVar171._8_4_ = uVar32;
        auVar171._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(local_1258 + k * 4 + 0x20);
        auVar180._4_4_ = uVar32;
        auVar180._0_4_ = uVar32;
        auVar180._8_4_ = uVar32;
        auVar180._12_4_ = uVar32;
        auVar51 = vsubps_avx(auVar120,auVar163);
        local_1028 = vsubps_avx(auVar128,auVar171);
        local_1038 = vsubps_avx(auVar94,auVar180);
        auVar62 = vsubps_avx(auVar138,auVar163);
        auVar50 = vsubps_avx(auVar108,auVar171);
        auVar73 = vsubps_avx(auVar53,auVar180);
        auVar74 = vsubps_avx(auVar64,auVar163);
        auVar75 = vsubps_avx(auVar187,auVar171);
        auVar76 = vsubps_avx(auVar150,auVar180);
        local_1048 = vsubps_avx(auVar74,auVar51);
        local_1058 = vsubps_avx(auVar75,local_1028);
        local_1068 = vsubps_avx(auVar76,local_1038);
        fVar167 = local_1028._0_4_;
        fVar88 = auVar75._0_4_ + fVar167;
        fVar85 = local_1028._4_4_;
        fVar97 = auVar75._4_4_ + fVar85;
        fVar87 = local_1028._8_4_;
        fVar99 = auVar75._8_4_ + fVar87;
        fVar10 = local_1028._12_4_;
        fVar101 = auVar75._12_4_ + fVar10;
        fVar72 = local_1038._0_4_;
        fVar103 = auVar76._0_4_ + fVar72;
        fVar86 = local_1038._4_4_;
        fVar113 = auVar76._4_4_ + fVar86;
        fVar9 = local_1038._8_4_;
        fVar115 = auVar76._8_4_ + fVar9;
        fVar11 = local_1038._12_4_;
        fVar117 = auVar76._12_4_ + fVar11;
        fVar61 = local_1068._0_4_;
        auVar139._0_4_ = fVar88 * fVar61;
        fVar71 = local_1068._4_4_;
        auVar139._4_4_ = fVar97 * fVar71;
        fVar15 = local_1068._8_4_;
        auVar139._8_4_ = fVar99 * fVar15;
        fVar16 = local_1068._12_4_;
        auVar139._12_4_ = fVar101 * fVar16;
        fVar186 = local_1058._0_4_;
        auVar151._0_4_ = fVar186 * fVar103;
        fVar189 = local_1058._4_4_;
        auVar151._4_4_ = fVar189 * fVar113;
        fVar190 = local_1058._8_4_;
        auVar151._8_4_ = fVar190 * fVar115;
        fVar191 = local_1058._12_4_;
        auVar151._12_4_ = fVar191 * fVar117;
        auVar90 = vsubps_avx(auVar151,auVar139);
        fVar154 = auVar51._0_4_;
        fVar137 = fVar154 + auVar74._0_4_;
        fVar157 = auVar51._4_4_;
        fVar147 = fVar157 + auVar74._4_4_;
        fVar158 = auVar51._8_4_;
        fVar148 = fVar158 + auVar74._8_4_;
        fVar159 = auVar51._12_4_;
        fVar149 = fVar159 + auVar74._12_4_;
        fVar179 = local_1048._0_4_;
        auVar109._0_4_ = fVar179 * fVar103;
        fVar183 = local_1048._4_4_;
        auVar109._4_4_ = fVar183 * fVar113;
        fVar184 = local_1048._8_4_;
        auVar109._8_4_ = fVar184 * fVar115;
        fVar185 = local_1048._12_4_;
        auVar109._12_4_ = fVar185 * fVar117;
        auVar152._0_4_ = fVar137 * fVar61;
        auVar152._4_4_ = fVar147 * fVar71;
        auVar152._8_4_ = fVar148 * fVar15;
        auVar152._12_4_ = fVar149 * fVar16;
        auVar91 = vsubps_avx(auVar152,auVar109);
        auVar140._0_4_ = fVar137 * fVar186;
        auVar140._4_4_ = fVar147 * fVar189;
        auVar140._8_4_ = fVar148 * fVar190;
        auVar140._12_4_ = fVar149 * fVar191;
        auVar95._0_4_ = fVar179 * fVar88;
        auVar95._4_4_ = fVar183 * fVar97;
        auVar95._8_4_ = fVar184 * fVar99;
        auVar95._12_4_ = fVar185 * fVar101;
        auVar92 = vsubps_avx(auVar95,auVar140);
        fVar88 = *(float *)(local_1258 + k * 4 + 0x60);
        fVar97 = *(float *)(local_1258 + k * 4 + 0x50);
        fVar99 = *(float *)(local_1258 + k * 4 + 0x40);
        local_12d8._0_4_ = auVar90._0_4_ * fVar99 + fVar88 * auVar92._0_4_ + fVar97 * auVar91._0_4_;
        local_12d8._4_4_ = auVar90._4_4_ * fVar99 + fVar88 * auVar92._4_4_ + fVar97 * auVar91._4_4_;
        fStack_12d0 = auVar90._8_4_ * fVar99 + fVar88 * auVar92._8_4_ + fVar97 * auVar91._8_4_;
        fStack_12cc = auVar90._12_4_ * fVar99 + fVar88 * auVar92._12_4_ + fVar97 * auVar91._12_4_;
        local_1078 = vsubps_avx(local_1028,auVar50);
        local_1098 = vsubps_avx(local_1038,auVar73);
        fVar117 = fVar167 + auVar50._0_4_;
        fVar137 = fVar85 + auVar50._4_4_;
        fVar147 = fVar87 + auVar50._8_4_;
        fVar148 = fVar10 + auVar50._12_4_;
        fVar149 = fVar72 + auVar73._0_4_;
        fVar114 = fVar86 + auVar73._4_4_;
        fVar116 = fVar9 + auVar73._8_4_;
        fVar118 = fVar11 + auVar73._12_4_;
        fVar101 = local_1098._0_4_;
        auVar181._0_4_ = fVar117 * fVar101;
        fVar103 = local_1098._4_4_;
        auVar181._4_4_ = fVar137 * fVar103;
        fVar113 = local_1098._8_4_;
        auVar181._8_4_ = fVar147 * fVar113;
        fVar115 = local_1098._12_4_;
        auVar181._12_4_ = fVar148 * fVar115;
        fVar169 = local_1078._0_4_;
        auVar78._0_4_ = fVar169 * fVar149;
        fVar173 = local_1078._4_4_;
        auVar78._4_4_ = fVar173 * fVar114;
        fVar175 = local_1078._8_4_;
        auVar78._8_4_ = fVar175 * fVar116;
        fVar177 = local_1078._12_4_;
        auVar78._12_4_ = fVar177 * fVar118;
        auVar90 = vsubps_avx(auVar78,auVar181);
        local_1088 = vsubps_avx(auVar51,auVar62);
        fVar162 = local_1088._0_4_;
        auVar110._0_4_ = fVar162 * fVar149;
        fVar165 = local_1088._4_4_;
        auVar110._4_4_ = fVar165 * fVar114;
        fVar166 = local_1088._8_4_;
        auVar110._8_4_ = fVar166 * fVar116;
        fVar168 = local_1088._12_4_;
        auVar110._12_4_ = fVar168 * fVar118;
        fVar149 = fVar154 + auVar62._0_4_;
        fVar114 = fVar157 + auVar62._4_4_;
        fVar116 = fVar158 + auVar62._8_4_;
        fVar118 = fVar159 + auVar62._12_4_;
        auVar141._0_4_ = fVar149 * fVar101;
        auVar141._4_4_ = fVar114 * fVar103;
        auVar141._8_4_ = fVar116 * fVar113;
        auVar141._12_4_ = fVar118 * fVar115;
        auVar51 = vsubps_avx(auVar141,auVar110);
        auVar129._0_4_ = fVar169 * fVar149;
        auVar129._4_4_ = fVar173 * fVar114;
        auVar129._8_4_ = fVar175 * fVar116;
        auVar129._12_4_ = fVar177 * fVar118;
        auVar96._0_4_ = fVar162 * fVar117;
        auVar96._4_4_ = fVar165 * fVar137;
        auVar96._8_4_ = fVar166 * fVar147;
        auVar96._12_4_ = fVar168 * fVar148;
        auVar91 = vsubps_avx(auVar96,auVar129);
        auVar155._0_4_ = fVar99 * auVar90._0_4_ + fVar88 * auVar91._0_4_ + fVar97 * auVar51._0_4_;
        auVar155._4_4_ = fVar99 * auVar90._4_4_ + fVar88 * auVar91._4_4_ + fVar97 * auVar51._4_4_;
        auVar155._8_4_ = fVar99 * auVar90._8_4_ + fVar88 * auVar91._8_4_ + fVar97 * auVar51._8_4_;
        auVar155._12_4_ =
             fVar99 * auVar90._12_4_ + fVar88 * auVar91._12_4_ + fVar97 * auVar51._12_4_;
        auVar51 = vsubps_avx(auVar62,auVar74);
        fVar117 = auVar62._0_4_ + auVar74._0_4_;
        fVar137 = auVar62._4_4_ + auVar74._4_4_;
        fVar147 = auVar62._8_4_ + auVar74._8_4_;
        fVar148 = auVar62._12_4_ + auVar74._12_4_;
        auVar62 = vsubps_avx(auVar50,auVar75);
        fVar149 = auVar75._0_4_ + auVar50._0_4_;
        fVar114 = auVar75._4_4_ + auVar50._4_4_;
        fVar116 = auVar75._8_4_ + auVar50._8_4_;
        fVar118 = auVar75._12_4_ + auVar50._12_4_;
        auVar50 = vsubps_avx(auVar73,auVar76);
        fVar119 = auVar73._0_4_ + auVar76._0_4_;
        fVar125 = auVar73._4_4_ + auVar76._4_4_;
        fVar126 = auVar73._8_4_ + auVar76._8_4_;
        fVar127 = auVar73._12_4_ + auVar76._12_4_;
        fVar170 = auVar50._0_4_;
        auVar130._0_4_ = fVar170 * fVar149;
        fVar174 = auVar50._4_4_;
        auVar130._4_4_ = fVar174 * fVar114;
        fVar176 = auVar50._8_4_;
        auVar130._8_4_ = fVar176 * fVar116;
        fVar178 = auVar50._12_4_;
        auVar130._12_4_ = fVar178 * fVar118;
        fVar89 = auVar62._0_4_;
        auVar142._0_4_ = fVar89 * fVar119;
        fVar98 = auVar62._4_4_;
        auVar142._4_4_ = fVar98 * fVar125;
        fVar100 = auVar62._8_4_;
        auVar142._8_4_ = fVar100 * fVar126;
        fVar102 = auVar62._12_4_;
        auVar142._12_4_ = fVar102 * fVar127;
        auVar62 = vsubps_avx(auVar142,auVar130);
        fVar104 = auVar51._0_4_;
        auVar121._0_4_ = fVar104 * fVar119;
        fVar119 = auVar51._4_4_;
        auVar121._4_4_ = fVar119 * fVar125;
        fVar125 = auVar51._8_4_;
        auVar121._8_4_ = fVar125 * fVar126;
        fVar126 = auVar51._12_4_;
        auVar121._12_4_ = fVar126 * fVar127;
        auVar143._0_4_ = fVar170 * fVar117;
        auVar143._4_4_ = fVar174 * fVar137;
        auVar143._8_4_ = fVar176 * fVar147;
        auVar143._12_4_ = fVar178 * fVar148;
        auVar51 = vsubps_avx(auVar143,auVar121);
        auVar65._0_4_ = fVar117 * fVar89;
        auVar65._4_4_ = fVar137 * fVar98;
        auVar65._8_4_ = fVar147 * fVar100;
        auVar65._12_4_ = fVar148 * fVar102;
        auVar79._0_4_ = fVar104 * fVar149;
        auVar79._4_4_ = fVar119 * fVar114;
        auVar79._8_4_ = fVar125 * fVar116;
        auVar79._12_4_ = fVar126 * fVar118;
        auVar50 = vsubps_avx(auVar79,auVar65);
        auVar66._0_4_ = fVar99 * auVar62._0_4_ + fVar88 * auVar50._0_4_ + fVar97 * auVar51._0_4_;
        auVar66._4_4_ = fVar99 * auVar62._4_4_ + fVar88 * auVar50._4_4_ + fVar97 * auVar51._4_4_;
        auVar66._8_4_ = fVar99 * auVar62._8_4_ + fVar88 * auVar50._8_4_ + fVar97 * auVar51._8_4_;
        auVar66._12_4_ = fVar99 * auVar62._12_4_ + fVar88 * auVar50._12_4_ + fVar97 * auVar51._12_4_
        ;
        auVar160._0_4_ = auVar66._0_4_ + auVar155._0_4_ + (float)local_12d8._0_4_;
        auVar160._4_4_ = auVar66._4_4_ + auVar155._4_4_ + (float)local_12d8._4_4_;
        auVar160._8_4_ = auVar66._8_4_ + auVar155._8_4_ + fStack_12d0;
        auVar160._12_4_ = auVar66._12_4_ + auVar155._12_4_ + fStack_12cc;
        auVar51 = vminps_avx((undefined1  [16])_local_12d8,auVar155);
        auVar51 = vminps_avx(auVar51,auVar66);
        auVar122._8_4_ = 0x7fffffff;
        auVar122._0_8_ = 0x7fffffff7fffffff;
        auVar122._12_4_ = 0x7fffffff;
        local_10a8 = vandps_avx(auVar160,auVar122);
        auVar123._0_4_ = local_10a8._0_4_ * 1.1920929e-07;
        auVar123._4_4_ = local_10a8._4_4_ * 1.1920929e-07;
        auVar123._8_4_ = local_10a8._8_4_ * 1.1920929e-07;
        auVar123._12_4_ = local_10a8._12_4_ * 1.1920929e-07;
        uVar23 = CONCAT44(auVar123._4_4_,auVar123._0_4_);
        auVar131._0_8_ = uVar23 ^ 0x8000000080000000;
        auVar131._8_4_ = -auVar123._8_4_;
        auVar131._12_4_ = -auVar123._12_4_;
        auVar51 = vcmpps_avx(auVar51,auVar131,5);
        auVar62 = vmaxps_avx((undefined1  [16])_local_12d8,auVar155);
        auVar62 = vmaxps_avx(auVar62,auVar66);
        auVar62 = vcmpps_avx(auVar62,auVar123,2);
        auVar51 = vorps_avx(auVar51,auVar62);
        if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar51[0xf] < '\0') {
          auVar67._0_4_ = fVar61 * fVar169;
          auVar67._4_4_ = fVar71 * fVar173;
          auVar67._8_4_ = fVar15 * fVar175;
          auVar67._12_4_ = fVar16 * fVar177;
          auVar80._0_4_ = fVar186 * fVar101;
          auVar80._4_4_ = fVar189 * fVar103;
          auVar80._8_4_ = fVar190 * fVar113;
          auVar80._12_4_ = fVar191 * fVar115;
          auVar73 = vsubps_avx(auVar80,auVar67);
          auVar124._0_4_ = fVar101 * fVar89;
          auVar124._4_4_ = fVar103 * fVar98;
          auVar124._8_4_ = fVar113 * fVar100;
          auVar124._12_4_ = fVar115 * fVar102;
          auVar132._0_4_ = fVar170 * fVar169;
          auVar132._4_4_ = fVar174 * fVar173;
          auVar132._8_4_ = fVar176 * fVar175;
          auVar132._12_4_ = fVar178 * fVar177;
          auVar74 = vsubps_avx(auVar132,auVar124);
          auVar144._8_4_ = 0x7fffffff;
          auVar144._0_8_ = 0x7fffffff7fffffff;
          auVar144._12_4_ = 0x7fffffff;
          auVar62 = vandps_avx(auVar144,auVar67);
          auVar50 = vandps_avx(auVar144,auVar124);
          auVar62 = vcmpps_avx(auVar62,auVar50,1);
          local_1168 = vblendvps_avx(auVar74,auVar73,auVar62);
          auVar54._0_4_ = fVar162 * fVar170;
          auVar54._4_4_ = fVar165 * fVar174;
          auVar54._8_4_ = fVar166 * fVar176;
          auVar54._12_4_ = fVar168 * fVar178;
          auVar68._0_4_ = fVar162 * fVar61;
          auVar68._4_4_ = fVar165 * fVar71;
          auVar68._8_4_ = fVar166 * fVar15;
          auVar68._12_4_ = fVar168 * fVar16;
          auVar81._0_4_ = fVar179 * fVar101;
          auVar81._4_4_ = fVar183 * fVar103;
          auVar81._8_4_ = fVar184 * fVar113;
          auVar81._12_4_ = fVar185 * fVar115;
          auVar73 = vsubps_avx(auVar68,auVar81);
          auVar133._0_4_ = fVar101 * fVar104;
          auVar133._4_4_ = fVar103 * fVar119;
          auVar133._8_4_ = fVar113 * fVar125;
          auVar133._12_4_ = fVar115 * fVar126;
          auVar74 = vsubps_avx(auVar133,auVar54);
          auVar62 = vandps_avx(auVar144,auVar81);
          auVar50 = vandps_avx(auVar144,auVar54);
          auVar62 = vcmpps_avx(auVar62,auVar50,1);
          local_1158 = vblendvps_avx(auVar74,auVar73,auVar62);
          auVar69._0_4_ = fVar104 * fVar169;
          auVar69._4_4_ = fVar119 * fVar173;
          auVar69._8_4_ = fVar125 * fVar175;
          auVar69._12_4_ = fVar126 * fVar177;
          auVar82._0_4_ = fVar179 * fVar169;
          auVar82._4_4_ = fVar183 * fVar173;
          auVar82._8_4_ = fVar184 * fVar175;
          auVar82._12_4_ = fVar185 * fVar177;
          auVar111._0_4_ = fVar162 * fVar186;
          auVar111._4_4_ = fVar165 * fVar189;
          auVar111._8_4_ = fVar166 * fVar190;
          auVar111._12_4_ = fVar168 * fVar191;
          auVar44._0_4_ = fVar162 * fVar89;
          auVar44._4_4_ = fVar165 * fVar98;
          auVar44._8_4_ = fVar166 * fVar100;
          auVar44._12_4_ = fVar168 * fVar102;
          auVar73 = vsubps_avx(auVar82,auVar111);
          auVar74 = vsubps_avx(auVar44,auVar69);
          auVar62 = vandps_avx(auVar144,auVar111);
          auVar50 = vandps_avx(auVar144,auVar69);
          auVar62 = vcmpps_avx(auVar62,auVar50,1);
          local_1148 = vblendvps_avx(auVar74,auVar73,auVar62);
          fVar61 = local_1168._0_4_ * fVar99 + local_1148._0_4_ * fVar88 + local_1158._0_4_ * fVar97
          ;
          fVar101 = local_1168._4_4_ * fVar99 +
                    local_1148._4_4_ * fVar88 + local_1158._4_4_ * fVar97;
          fVar71 = local_1168._8_4_ * fVar99 + local_1148._8_4_ * fVar88 + local_1158._8_4_ * fVar97
          ;
          fVar88 = local_1168._12_4_ * fVar99 +
                   local_1148._12_4_ * fVar88 + local_1158._12_4_ * fVar97;
          auVar70._0_4_ = fVar61 + fVar61;
          auVar70._4_4_ = fVar101 + fVar101;
          auVar70._8_4_ = fVar71 + fVar71;
          auVar70._12_4_ = fVar88 + fVar88;
          fVar72 = local_1168._0_4_ * fVar154 +
                   local_1148._0_4_ * fVar72 + local_1158._0_4_ * fVar167;
          fVar85 = local_1168._4_4_ * fVar157 +
                   local_1148._4_4_ * fVar86 + local_1158._4_4_ * fVar85;
          fVar86 = local_1168._8_4_ * fVar158 + local_1148._8_4_ * fVar9 + local_1158._8_4_ * fVar87
          ;
          fVar87 = local_1168._12_4_ * fVar159 +
                   local_1148._12_4_ * fVar11 + local_1158._12_4_ * fVar10;
          auVar62 = vrcpps_avx(auVar70);
          fVar88 = auVar62._0_4_;
          auVar134._0_4_ = auVar70._0_4_ * fVar88;
          fVar97 = auVar62._4_4_;
          auVar134._4_4_ = auVar70._4_4_ * fVar97;
          fVar99 = auVar62._8_4_;
          auVar134._8_4_ = auVar70._8_4_ * fVar99;
          fVar167 = auVar62._12_4_;
          auVar134._12_4_ = auVar70._12_4_ * fVar167;
          auVar145._8_4_ = 0x3f800000;
          auVar145._0_8_ = &DAT_3f8000003f800000;
          auVar145._12_4_ = 0x3f800000;
          auVar62 = vsubps_avx(auVar145,auVar134);
          auVar135._0_4_ = fVar88 * auVar62._0_4_;
          auVar135._4_4_ = fVar97 * auVar62._4_4_;
          auVar135._8_4_ = fVar99 * auVar62._8_4_;
          auVar135._12_4_ = fVar167 * auVar62._12_4_;
          local_1178._0_4_ = (fVar72 + fVar72) * (fVar88 + auVar135._0_4_);
          local_1178._4_4_ = (fVar85 + fVar85) * (fVar97 + auVar135._4_4_);
          local_1178._8_4_ = (fVar86 + fVar86) * (fVar99 + auVar135._8_4_);
          local_1178._12_4_ = (fVar87 + fVar87) * (fVar167 + auVar135._12_4_);
          auVar49 = ZEXT1664(local_1178);
          uVar32 = *(undefined4 *)(local_1258 + k * 4 + 0x30);
          auVar83._4_4_ = uVar32;
          auVar83._0_4_ = uVar32;
          auVar83._8_4_ = uVar32;
          auVar83._12_4_ = uVar32;
          auVar62 = vcmpps_avx(auVar83,local_1178,2);
          uVar32 = *(undefined4 *)(local_1258 + k * 4 + 0x80);
          auVar112._4_4_ = uVar32;
          auVar112._0_4_ = uVar32;
          auVar112._8_4_ = uVar32;
          auVar112._12_4_ = uVar32;
          auVar50 = vcmpps_avx(local_1178,auVar112,2);
          auVar62 = vandps_avx(auVar50,auVar62);
          auVar50 = auVar51 & auVar62;
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar51 = vandps_avx(auVar51,auVar62);
            auVar62 = vcmpps_avx(auVar70,_DAT_01feba10,4);
            auVar50 = auVar62 & auVar51;
            if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar50[0xf] < '\0') {
              valid.field_0 =
                   (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar51,auVar62);
              tNear.field_0 = _local_12d8;
              auVar51 = vrcpps_avx(auVar160);
              fVar88 = auVar51._0_4_;
              auVar55._0_4_ = auVar160._0_4_ * fVar88;
              fVar97 = auVar51._4_4_;
              auVar55._4_4_ = auVar160._4_4_ * fVar97;
              fVar99 = auVar51._8_4_;
              auVar55._8_4_ = auVar160._8_4_ * fVar99;
              fVar167 = auVar51._12_4_;
              auVar55._12_4_ = auVar160._12_4_ * fVar167;
              auVar84._8_4_ = 0x3f800000;
              auVar84._0_8_ = &DAT_3f8000003f800000;
              auVar84._12_4_ = 0x3f800000;
              auVar51 = vsubps_avx(auVar84,auVar55);
              auVar45._0_4_ = fVar88 + fVar88 * auVar51._0_4_;
              auVar45._4_4_ = fVar97 + fVar97 * auVar51._4_4_;
              auVar45._8_4_ = fVar99 + fVar99 * auVar51._8_4_;
              auVar45._12_4_ = fVar167 + fVar167 * auVar51._12_4_;
              auVar56._8_4_ = 0x219392ef;
              auVar56._0_8_ = 0x219392ef219392ef;
              auVar56._12_4_ = 0x219392ef;
              auVar51 = vcmpps_avx(local_10a8,auVar56,5);
              auVar51 = vandps_avx(auVar51,auVar45);
              auVar57._0_4_ = (float)local_12d8._0_4_ * auVar51._0_4_;
              auVar57._4_4_ = (float)local_12d8._4_4_ * auVar51._4_4_;
              auVar57._8_4_ = fStack_12d0 * auVar51._8_4_;
              auVar57._12_4_ = fStack_12cc * auVar51._12_4_;
              local_1198 = vminps_avx(auVar57,auVar84);
              auVar46._0_4_ = auVar155._0_4_ * auVar51._0_4_;
              auVar46._4_4_ = auVar155._4_4_ * auVar51._4_4_;
              auVar46._8_4_ = auVar155._8_4_ * auVar51._8_4_;
              auVar46._12_4_ = auVar155._12_4_ * auVar51._12_4_;
              local_1188 = vminps_avx(auVar46,auVar84);
              auVar58._8_4_ = 0x7f800000;
              auVar58._0_8_ = 0x7f8000007f800000;
              auVar58._12_4_ = 0x7f800000;
              auVar51 = vblendvps_avx(auVar58,local_1178,(undefined1  [16])valid.field_0);
              auVar62 = vshufps_avx(auVar51,auVar51,0xb1);
              auVar62 = vminps_avx(auVar62,auVar51);
              auVar50 = vshufpd_avx(auVar62,auVar62,1);
              auVar62 = vminps_avx(auVar50,auVar62);
              auVar62 = vcmpps_avx(auVar51,auVar62,0);
              auVar50 = (undefined1  [16])valid.field_0 & auVar62;
              auVar51 = vpcmpeqd_avx(auVar51,auVar51);
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') {
                auVar51 = auVar62;
              }
              auVar51 = vandps_avx((undefined1  [16])valid.field_0,auVar51);
              uVar32 = vmovmskps_avx(auVar51);
              uVar23 = CONCAT44((int)((ulong)&mapUV >> 0x20),uVar32);
              lVar40 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              auVar51 = vpcmpeqd_avx(auVar135,auVar135);
              auVar136 = ZEXT1664(auVar51);
              scene = pSVar7;
LAB_0035367d:
              uVar6 = *(uint *)((long)&local_1018 + lVar40 * 4);
              pRVar24 = (RTCRayN *)(ulong)uVar6;
              pGVar8 = (pSVar7->geometries).items[(long)pRVar24].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar40] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar32 = *(undefined4 *)(local_1198 + lVar40 * 4);
                  uVar4 = *(undefined4 *)(local_1188 + lVar40 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1178 + lVar40 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1168 + lVar40 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1158 + lVar40 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1148 + lVar40 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar32;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_11f8 + lVar40 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar6;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_00353a83;
                }
                uVar32 = *(undefined4 *)(local_1198 + lVar40 * 4);
                local_fd8._4_4_ = uVar32;
                local_fd8._0_4_ = uVar32;
                local_fd8._8_4_ = uVar32;
                local_fd8._12_4_ = uVar32;
                local_fc8 = *(undefined4 *)(local_1188 + lVar40 * 4);
                local_fa8 = vpshufd_avx(ZEXT416(uVar6),0);
                uVar32 = *(undefined4 *)((long)&local_11f8 + lVar40 * 4);
                local_fb8._4_4_ = uVar32;
                local_fb8._0_4_ = uVar32;
                local_fb8._8_4_ = uVar32;
                local_fb8._12_4_ = uVar32;
                uVar32 = *(undefined4 *)(local_1168 + lVar40 * 4);
                uVar4 = *(undefined4 *)(local_1158 + lVar40 * 4);
                local_ff8._4_4_ = uVar4;
                local_ff8._0_4_ = uVar4;
                local_ff8._8_4_ = uVar4;
                local_ff8._12_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_1148 + lVar40 * 4);
                local_fe8._4_4_ = uVar4;
                local_fe8._0_4_ = uVar4;
                local_fe8._8_4_ = uVar4;
                local_fe8._12_4_ = uVar4;
                local_1008[0] = (RTCHitN)(char)uVar32;
                local_1008[1] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar32;
                local_1008[5] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar32;
                local_1008[9] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar32;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                uStack_fc4 = local_fc8;
                uStack_fc0 = local_fc8;
                uStack_fbc = local_fc8;
                vcmpps_avx(ZEXT1632(local_fd8),ZEXT1632(local_fd8),0xf);
                uStack_f94 = context->user->instID[0];
                local_f98 = uStack_f94;
                uStack_f90 = uStack_f94;
                uStack_f8c = uStack_f94;
                uStack_f88 = context->user->instPrimID[0];
                uStack_f84 = uStack_f88;
                uStack_f80 = uStack_f88;
                uStack_f7c = uStack_f88;
                uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1178 + lVar40 * 4);
                local_1298 = *local_1280;
                uStack_1290 = local_1280[1];
                args.valid = (int *)&local_1298;
                args.geometryUserPtr = pGVar8->userPtr;
                args.context = context->user;
                args.ray = (RTCRayN *)ray;
                args.hit = local_1008;
                args.N = 4;
                pRVar24 = (RTCRayN *)pGVar8->intersectionFilterN;
                auVar51 = auVar49._0_16_;
                if (pRVar24 != (RTCRayN *)0x0) {
                  auVar62 = auVar136._0_16_;
                  pRVar24 = (RTCRayN *)(*(code *)pRVar24)(&args);
                  auVar49 = ZEXT1664(auVar51);
                  auVar62 = vpcmpeqd_avx(auVar62,auVar62);
                  auVar136 = ZEXT1664(auVar62);
                }
                auVar17._8_8_ = uStack_1290;
                auVar17._0_8_ = local_1298;
                auVar62 = auVar136._0_16_;
                if (auVar17 == (undefined1  [16])0x0) {
                  auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar51 = auVar51 ^ auVar62;
                }
                else {
                  pRVar24 = (RTCRayN *)context->args->filter;
                  if ((pRVar24 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    pRVar24 = (RTCRayN *)(*(code *)pRVar24)(&args);
                    auVar49 = ZEXT1664(auVar51);
                    auVar51 = vpcmpeqd_avx(auVar62,auVar62);
                    auVar136 = ZEXT1664(auVar51);
                  }
                  auVar18._8_8_ = uStack_1290;
                  auVar18._0_8_ = local_1298;
                  auVar62 = vpcmpeqd_avx(auVar18,_DAT_01feba10);
                  auVar51 = auVar62 ^ auVar136._0_16_;
                  if (auVar18 != (undefined1  [16])0x0) {
                    auVar62 = auVar62 ^ auVar136._0_16_;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])args.hit);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x10));
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x20));
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x30));
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x40));
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar50;
                    auVar62 = vmaskmovps_avx(auVar62,*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar62;
                    pRVar24 = args.ray;
                  }
                }
                auVar60._8_8_ = 0x100000001;
                auVar60._0_8_ = 0x100000001;
                if ((auVar60 & auVar51) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
                }
                valid.field_0.v[lVar40] = 0.0;
                uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar48._4_4_ = uVar32;
                auVar48._0_4_ = uVar32;
                auVar48._8_4_ = uVar32;
                auVar48._12_4_ = uVar32;
                auVar51 = vcmpps_avx(auVar49._0_16_,auVar48,2);
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vandps_avx(auVar51,(undefined1  [16])valid.field_0);
              }
              if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0 &&
                   ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                   (undefined1  [16])0x0) &&
                  ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) goto LAB_00353a83;
              auVar59._8_4_ = 0x7f800000;
              auVar59._0_8_ = 0x7f8000007f800000;
              auVar59._12_4_ = 0x7f800000;
              auVar51 = vblendvps_avx(auVar59,auVar49._0_16_,(undefined1  [16])valid.field_0);
              auVar62 = vshufps_avx(auVar51,auVar51,0xb1);
              auVar62 = vminps_avx(auVar62,auVar51);
              auVar50 = vshufpd_avx(auVar62,auVar62,1);
              auVar62 = vminps_avx(auVar50,auVar62);
              auVar51 = vcmpps_avx(auVar51,auVar62,0);
              auVar62 = (undefined1  [16])valid.field_0 & auVar51;
              aVar47 = valid.field_0;
              if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar62[0xf] < '\0') {
                aVar47.v = (__m128)vandps_avx(auVar51,valid.field_0);
              }
              uVar32 = vmovmskps_avx((undefined1  [16])aVar47);
              uVar23 = CONCAT44((int)((ulong)pRVar24 >> 0x20),uVar32);
              lVar40 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              goto LAB_0035367d;
            }
          }
        }
LAB_00353a83:
        local_1240 = local_1240 + 1;
        pRVar26 = ray;
      } while (local_1240 != local_1250);
    }
    uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar49 = ZEXT1664(CONCAT412(uVar32,CONCAT48(uVar32,CONCAT44(uVar32,uVar32))));
    auVar136 = ZEXT1664(local_10b8);
    auVar146 = ZEXT1664(local_10c8);
    auVar153 = ZEXT1664(local_10d8);
    auVar156 = ZEXT1664(local_10e8);
    auVar161 = ZEXT1664(local_10f8);
    auVar164 = ZEXT1664(local_1108);
    auVar172 = ZEXT1664(local_1118);
    auVar182 = ZEXT1664(local_1128);
    auVar188 = ZEXT1664(local_1138);
    uVar36 = local_1278;
    uVar23 = local_1260;
    uVar28 = local_1268;
    uVar29 = local_1270;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }